

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.h
# Opt level: O2

void __thiscall
cali::Preprocessor::operator()
          (Preprocessor *this,CaliperMetadataAccessInterface *db,EntryList *rec,
          SnapshotProcessFn *push)

{
  _Vector_base<cali::Entry,_std::allocator<cali::Entry>_> local_30;
  
  cali::Preprocessor::process((CaliperMetadataAccessInterface *)&local_30,(vector *)this);
  std::
  function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
  ::operator()(push,db,(vector<cali::Entry,_std::allocator<cali::Entry>_> *)&local_30);
  std::_Vector_base<cali::Entry,_std::allocator<cali::Entry>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

void operator() (CaliperMetadataAccessInterface& db, const EntryList& rec, SnapshotProcessFn push)
    {
        push(db, process(db, rec));
    }